

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_viewport.cpp
# Opt level: O0

ON_Object * __thiscall ON_Viewport::Internal_DeepCopy(ON_Viewport *this)

{
  ON_Viewport *this_00;
  ON_Viewport *this_local;
  
  this_00 = (ON_Viewport *)operator_new(0x248);
  ON_Viewport(this_00,this);
  return (ON_Object *)this_00;
}

Assistant:

static double len2d( double x, double y )
{
  double d= 0.0;
  double fx = fabs(x);
  double fy = fabs(y);
  if ( fx > fy ) {
    d = fy/fx;
    d = fx*sqrt(1.0+d*d);
  }
  else if ( fy > fx ){
    d = fx/fy;
    d = fy*sqrt(1.0+d*d);
  }
  return d;
}